

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O0

void __thiscall
inja::BlockStatementNode::BlockStatementNode
          (BlockStatementNode *this,BlockNode *parent,string *name,size_t pos)

{
  size_t pos_local;
  string *name_local;
  BlockNode *parent_local;
  BlockStatementNode *this_local;
  
  StatementNode::StatementNode(&this->super_StatementNode,pos);
  (this->super_StatementNode).super_AstNode._vptr_AstNode = (_func_int **)&PTR_accept_001c26c0;
  ::std::__cxx11::string::string((string *)&this->name,(string *)name);
  BlockNode::BlockNode(&this->block);
  this->parent = parent;
  return;
}

Assistant:

explicit BlockStatementNode(BlockNode* const parent, const std::string& name, size_t pos): StatementNode(pos), name(name), parent(parent) {}